

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpserver.cpp
# Opt level: O0

void uv::AfterRecv(uv_stream_t *handle,ssize_t nread,uv_buf_t *buf)

{
  void *pvVar1;
  FILE *__stream;
  CStringStream *pCVar2;
  ILog4zManager *pIVar3;
  undefined8 uVar4;
  long *in_FS_OFFSET;
  AcceptClient *acceptclient;
  string local_b0;
  undefined1 local_90 [8];
  CStringStream ss_2;
  undefined1 local_58 [8];
  CStringStream ss_1;
  CStringStream ss;
  TcpClientCtx *theclass;
  uv_buf_t *buf_local;
  ssize_t nread_local;
  uv_stream_t *handle_local;
  
  __stream = _stdout;
  pvVar1 = handle->data;
  if (pvVar1 == (void *)0x0) {
    __assert_fail("theclass",
                  "/workspace/llm4binary/github/license_c_cmakelists/wqvbjhc[P]libuv_tcp/tcpserver.cpp"
                  ,0x246,"void uv::AfterRecv(uv_stream_t *, ssize_t, const uv_buf_t *)");
  }
  buf_local._0_4_ = (int)nread;
  if (nread < 0) {
    if (nread == -0xfff) {
      fprintf(_stdout,"client(%d)eof\n",(ulong)*(uint *)((long)pvVar1 + 0x110));
      zsummer::log4z::CStringStream::CStringStream
                ((CStringStream *)&ss_1.m_pCur,(char *)(*in_FS_OFFSET + -0x800),0x800);
      pCVar2 = zsummer::log4z::CStringStream::operator<<((CStringStream *)&ss_1.m_pCur,"client(");
      pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2,*(int *)((long)pvVar1 + 0x110));
      zsummer::log4z::CStringStream::operator<<(pCVar2,")eof");
      pCVar2 = zsummer::log4z::CStringStream::operator<<((CStringStream *)&ss_1.m_pCur," ( ");
      pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2," ");
      pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2," ) : ");
      zsummer::log4z::CStringStream::operator<<(pCVar2,0x24a);
      pIVar3 = zsummer::log4z::ILog4zManager::GetInstance();
      (*pIVar3->_vptr_ILog4zManager[8])(pIVar3,0,2,*in_FS_OFFSET + -0x800);
    }
    else if (nread == -0x68) {
      fprintf(_stdout,"client(%d)conn reset\n",(ulong)*(uint *)((long)pvVar1 + 0x110));
      zsummer::log4z::CStringStream::CStringStream
                ((CStringStream *)local_58,(char *)(*in_FS_OFFSET + -0x800),0x800);
      pCVar2 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_58,"client(");
      pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2,*(int *)((long)pvVar1 + 0x110));
      zsummer::log4z::CStringStream::operator<<(pCVar2,")conn reset");
      pCVar2 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_58," ( ");
      pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2," ");
      pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2," ) : ");
      zsummer::log4z::CStringStream::operator<<(pCVar2,0x24d);
      pIVar3 = zsummer::log4z::ILog4zManager::GetInstance();
      (*pIVar3->_vptr_ILog4zManager[8])(pIVar3,0,2,*in_FS_OFFSET + -0x800);
    }
    else {
      GetUVError_abi_cxx11_((string *)&ss_2.m_pCur,(int)buf_local);
      uVar4 = std::__cxx11::string::c_str();
      fprintf(__stream,"%s\n",uVar4);
      std::__cxx11::string::~string((string *)&ss_2.m_pCur);
      zsummer::log4z::CStringStream::CStringStream
                ((CStringStream *)local_90,(char *)(*in_FS_OFFSET + -0x800),0x800);
      pCVar2 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_90,"client(");
      pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2,*(int *)((long)pvVar1 + 0x110));
      pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2,anon_var_dwarf_ae2e);
      GetUVError_abi_cxx11_(&local_b0,(int)buf_local);
      zsummer::log4z::CStringStream::operator<<(pCVar2,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      pCVar2 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_90," ( ");
      pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2," ");
      pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2," ) : ");
      zsummer::log4z::CStringStream::operator<<(pCVar2,0x250);
      pIVar3 = zsummer::log4z::ILog4zManager::GetInstance();
      (*pIVar3->_vptr_ILog4zManager[8])(pIVar3,0,2,*in_FS_OFFSET + -0x800);
    }
    AcceptClient::Close(*(AcceptClient **)((long)pvVar1 + 0x120));
  }
  else if (nread != 0) {
    PacketSync::recvdata(*(PacketSync **)((long)pvVar1 + 0xf8),(uchar *)buf->base,(int)buf_local);
  }
  return;
}

Assistant:

void AfterRecv(uv_stream_t* handle, ssize_t nread, const uv_buf_t* buf)
{
    TcpClientCtx* theclass = (TcpClientCtx*)handle->data;
    assert(theclass);
    if (nread < 0) {/* Error or EOF */
        if (nread == UV_EOF) {
            fprintf(stdout, "client(%d)eof\n", theclass->clientid);
            LOGW("client(" << theclass->clientid << ")eof");
        } else if (nread == UV_ECONNRESET) {
            fprintf(stdout, "client(%d)conn reset\n", theclass->clientid);
            LOGW("client(" << theclass->clientid << ")conn reset");
        } else {
            fprintf(stdout, "%s\n", GetUVError(nread).c_str());
            LOGW("client(" << theclass->clientid << ")：" << GetUVError(nread));
        }
        AcceptClient* acceptclient = (AcceptClient*)theclass->parent_acceptclient;
        acceptclient->Close();
        return;
    } else if (0 == nread)  {/* Everything OK, but nothing read. */

    } else {
        theclass->packet_->recvdata((const unsigned char*)buf->base, nread);
    }
}